

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow *window)

{
  ImVec2 IVar1;
  undefined1 auVar2 [16];
  ImGuiContext *pIVar3;
  ImGuiViewportP *this;
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar6 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ImRect IVar10;
  ImRect IVar11;
  undefined1 auVar5 [56];
  undefined1 auVar7 [56];
  
  pIVar3 = GImGui;
  auVar7 = in_ZMM1._8_56_;
  auVar5 = in_ZMM0._8_56_;
  this = (ImGuiViewportP *)GetMainViewport();
  IVar10 = ImGuiViewportP::GetMainRect(this);
  auVar6._0_8_ = IVar10.Max;
  auVar6._8_56_ = auVar7;
  auVar4._0_8_ = IVar10.Min;
  auVar4._8_56_ = auVar5;
  IVar1 = (pIVar3->Style).DisplaySafeAreaPadding;
  auVar2 = vsubps_avx(auVar6._0_16_,auVar4._0_16_);
  auVar9._0_4_ = IVar1.x + IVar1.x;
  auVar9._4_4_ = IVar1.y + IVar1.y;
  auVar9._8_8_ = 0;
  auVar2 = vcmpps_avx(auVar9,auVar2,1);
  auVar8._0_8_ = (ulong)IVar1 ^ 0x8000000080000000;
  auVar8._8_4_ = 0x80000000;
  auVar8._12_4_ = 0x80000000;
  auVar2 = vandps_avx(auVar2,auVar8);
  auVar8 = vsubps_avx(auVar4._0_16_,auVar2);
  IVar11.Max.x = IVar10.Max.x + auVar2._0_4_;
  IVar11.Max.y = IVar10.Max.y + auVar2._4_4_;
  IVar11.Min = auVar8._0_8_;
  return IVar11;
}

Assistant:

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_UNUSED(window);
    ImRect r_screen = ((ImGuiViewportP*)(void*)GetMainViewport())->GetMainRect();
    ImVec2 padding = g.Style.DisplaySafeAreaPadding;
    r_screen.Expand(ImVec2((r_screen.GetWidth() > padding.x * 2) ? -padding.x : 0.0f, (r_screen.GetHeight() > padding.y * 2) ? -padding.y : 0.0f));
    return r_screen;
}